

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManFilter_rec(If_DsdMan_t *pNew,If_DsdMan_t *p,int i,Vec_Int_t *vMap)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  If_DsdObj_t *pIVar4;
  int *pMap;
  bool bVar5;
  word *local_c0;
  int local_70;
  int Id;
  int iFanin;
  int k;
  int pFanins [12];
  If_DsdObj_t *pObj;
  Vec_Int_t *vMap_local;
  int i_local;
  If_DsdMan_t *p_local;
  If_DsdMan_t *pNew_local;
  
  iVar3 = Vec_IntEntry(vMap,i);
  if (iVar3 < 0) {
    pIVar4 = If_DsdVecObj(&p->vObjs,i);
    Id = 0;
    while( true ) {
      iVar3 = If_DsdObjFaninNum(pIVar4);
      bVar5 = false;
      if (Id < iVar3) {
        local_70 = If_DsdObjFaninLit(pIVar4,Id);
        bVar5 = local_70 != 0;
      }
      if (!bVar5) break;
      iVar3 = Abc_Lit2Var(local_70);
      If_DsdManFilter_rec(pNew,p,iVar3,vMap);
      Id = Id + 1;
    }
    Id = 0;
    while( true ) {
      iVar3 = If_DsdObjFaninNum(pIVar4);
      bVar5 = false;
      if (Id < iVar3) {
        local_70 = If_DsdObjFaninLit(pIVar4,Id);
        bVar5 = local_70 != 0;
      }
      if (!bVar5) break;
      pMap = Vec_IntArray(vMap);
      iVar3 = Abc_Lit2LitV(pMap,local_70);
      (&iFanin)[Id] = iVar3;
      Id = Id + 1;
    }
    uVar1 = *(uint *)&pIVar4->field_0x4;
    uVar2 = *(uint *)&pIVar4->field_0x4;
    if ((*(uint *)&pIVar4->field_0x4 & 7) == 6) {
      local_c0 = If_DsdObjTruth(p,pIVar4);
    }
    else {
      local_c0 = (word *)0x0;
    }
    iVar3 = If_DsdObjFindOrAdd(pNew,uVar1 & 7,&iFanin,uVar2 >> 0x1b,local_c0);
    if ((*(uint *)&pIVar4->field_0x4 >> 8 & 1) != 0) {
      If_DsdVecObjSetMark(&pNew->vObjs,iVar3);
    }
    uVar1 = *(uint *)&pIVar4->field_0x4;
    pIVar4 = If_DsdVecObj(&pNew->vObjs,iVar3);
    *(uint *)&pIVar4->field_0x4 =
         *(uint *)&pIVar4->field_0x4 & 0xf80001ff | (uVar1 >> 9 & 0x3ffff) << 9;
    Vec_IntWriteEntry(vMap,i,iVar3);
  }
  return;
}

Assistant:

void If_DsdManFilter_rec( If_DsdMan_t * pNew, If_DsdMan_t * p, int i, Vec_Int_t * vMap )
{
    If_DsdObj_t * pObj;
    int pFanins[DAU_MAX_VAR];
    int k, iFanin, Id;
    if ( Vec_IntEntry(vMap, i) >= 0 )
        return;
    // call recursively
    pObj = If_DsdVecObj( &p->vObjs, i );
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, k )
        If_DsdManFilter_rec( pNew, p, Abc_Lit2Var(iFanin), vMap );
    // duplicate this one
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, k )
        pFanins[k] = Abc_Lit2LitV( Vec_IntArray(vMap), iFanin );
    Id = If_DsdObjFindOrAdd( pNew, pObj->Type, pFanins, pObj->nFans, pObj->Type == IF_DSD_PRIME ? If_DsdObjTruth(p, pObj) : NULL );
    if ( pObj->fMark )
        If_DsdVecObjSetMark( &pNew->vObjs, Id );
    If_DsdVecObj( &pNew->vObjs, Id )->Count = pObj->Count;
    // save the result
    Vec_IntWriteEntry( vMap, i, Id );
}